

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptor.hpp
# Opt level: O0

iterator_range<boost::range_detail::integer_iterator<int>_>
burst::operator|(integer_range<int> *range,
                adaptor_compare_forwarder_t<burst::take_exactly_t,_std::tuple<long>_> *forwarder)

{
  iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
  iVar1;
  forward_tuple_fn local_40 [8];
  tuple<long_&&> local_38;
  tuple<boost::integer_range<int>_&&,_long_&&> local_30;
  adaptor_compare_forwarder_t<burst::take_exactly_t,_std::tuple<long>_> *local_20;
  adaptor_compare_forwarder_t<burst::take_exactly_t,_std::tuple<long>_> *forwarder_local;
  integer_range<int> *range_local;
  
  local_20 = forwarder;
  forwarder_local = (adaptor_compare_forwarder_t<burst::take_exactly_t,_std::tuple<long>_> *)range;
  std::forward_as_tuple<boost::integer_range<int>>((integer_range<int> *)&local_38);
  forward_tuple_fn::operator()(local_40,(tuple<long> *)&forward_tuple);
  std::tuple_cat<std::tuple<boost::integer_range<int>&&>,std::tuple<long&&>,void>
            ((tuple<boost::integer_range<int>_&&> *)&local_30,&local_38);
  iVar1.
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
       = (iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          )apply<burst::take_exactly_t&,std::tuple<boost::integer_range<int>&&,long&&>>
                     ((take_exactly_t *)forwarder,&local_30);
  return (iterator_range<boost::range_detail::integer_iterator<int>_>)
         (iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          )iVar1.
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

auto operator | (Range && range, adaptor_compare_forwarder_t<Adaptor, Tuple> forwarder)
    {
        return
            burst::apply
            (
                forwarder.adaptor,
                std::tuple_cat
                (
                    std::forward_as_tuple(std::forward<Range>(range)),
                    forward_tuple(std::move(forwarder.arguments))
                )
            );
    }